

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O2

Employee * __thiscall Company::maxEfficiency(Company *this)

{
  int iVar1;
  Employee *this_00;
  int i;
  long lVar2;
  double dVar3;
  double dVar4;
  
  this_00 = *this->employees;
  lVar2 = 1;
  while( true ) {
    iVar1 = Boss::getNumberOfEmployees(this->boss);
    if (iVar1 <= lVar2) break;
    dVar3 = Employee::efficiency(this->employees[lVar2]);
    dVar4 = Employee::efficiency(this_00);
    if (dVar4 < dVar3) {
      this_00 = this->employees[lVar2];
    }
    lVar2 = lVar2 + 1;
  }
  return this_00;
}

Assistant:

Employee *Company::maxEfficiency() const {
    // return a pointer to the employee with maximum efficiency
    Employee *max = employees[0];
    for (int i = 1; i < boss->getNumberOfEmployees(); ++i) {
        if (employees[i]->efficiency() > max->efficiency())
            max = employees[i];
    }
    return max;
}